

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

iterator pybind11::
         make_iterator<(pybind11::return_value_policy)6,VarIterator,VarIterator,std::shared_ptr<kratos::Var>>
                   (VarIterator first,VarIterator last)

{
  VarIterator last_00;
  iterator iVar1;
  VarIterator last_local;
  VarIterator first_local;
  
  last_00._8_8_ = last._8_8_;
  last_00.parent_ = (Var *)(ulong)(uint)last.parent_;
  iVar1 = detail::
          make_iterator_impl<pybind11::detail::iterator_access<VarIterator,std::shared_ptr<kratos::Var>>,(pybind11::return_value_policy)6,VarIterator,VarIterator,std::shared_ptr<kratos::Var>>
                    (first,last_00);
  iVar1.super_object.super_handle.m_ptr = (handle)(handle)first.parent_;
  return iVar1;
}

Assistant:

iterator make_iterator(Iterator first, Sentinel last, Extra &&... extra) {
    return detail::make_iterator_impl<
        detail::iterator_access<Iterator>,
        Policy,
        Iterator,
        Sentinel,
        ValueType,
        Extra...>(first, last, std::forward<Extra>(extra)...);
}